

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  int *piVar1;
  int iVar2;
  uint elem;
  uint *puVar3;
  bool bVar4;
  char *__function;
  long lVar5;
  int iVar6;
  ulong uVar7;
  CRef cr;
  uint local_34;
  
  if (0 < (long)ps->sz) {
    lVar5 = 0;
    do {
      iVar6 = ps->data[lVar5].x >> 1;
      if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6)
      {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, char>::operator[](K) const [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar6]
          != '\0') {
        __assert_fail("!isEliminated(var(ps[i]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                      ,0x98,"bool Minisat::SimpSolver::addClause_(vec<Lit> &)");
      }
      lVar5 = lVar5 + 1;
    } while (ps->sz != lVar5);
  }
  iVar6 = (this->super_Solver).clauses.sz;
  if ((this->use_rcheck != false) && (bVar4 = implied(this,ps), bVar4)) {
    return true;
  }
  bVar4 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar4) {
    bVar4 = true;
    if ((this->use_simplification == true) &&
       (iVar2 = (this->super_Solver).clauses.sz, iVar2 == iVar6 + 1)) {
      elem = (this->super_Solver).clauses.data[(long)iVar2 + -1];
      if ((this->super_Solver).ca.ra.sz <= elem) {
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                      ,0x3f,
                      "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                     );
      }
      puVar3 = (this->super_Solver).ca.ra.memory;
      Queue<unsigned_int>::insert(&this->subsumption_queue,elem);
      if (0x1f < puVar3[elem]) {
        puVar3 = puVar3 + elem;
        uVar7 = 0;
        do {
          if ((this->occurs).occs.map.sz <= (int)puVar3[uVar7 + 1] >> 1) {
            __function = 
            "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
LAB_001102f2:
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                          ,0x28,__function);
          }
          vec<unsigned_int,_int>::push
                    ((this->occurs).occs.map.data + ((int)puVar3[uVar7 + 1] >> 1),&local_34);
          if ((this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.sz <=
              (int)puVar3[uVar7 + 1]) {
            __function = 
            "V &Minisat::IntMap<Minisat::Lit, int, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = int, MkIndex = Minisat::MkIndexLit]"
            ;
            goto LAB_001102f2;
          }
          piVar1 = (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data +
                   (int)puVar3[uVar7 + 1];
          *piVar1 = *piVar1 + 1;
          if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
              (int)puVar3[uVar7 + 1] >> 1) {
            __function = 
            "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
            goto LAB_001102f2;
          }
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
          [(int)puVar3[uVar7 + 1] >> 1] = '\x01';
          this->n_touched = this->n_touched + 1;
          iVar6 = (int)puVar3[uVar7 + 1] >> 1;
          if ((iVar6 < (this->elim_heap).indices.map.sz) &&
             (-1 < (this->elim_heap).indices.map.data[iVar6])) {
            Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::increase
                      (&this->elim_heap,iVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < *puVar3 >> 5);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}